

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TPZFlopCounter>::SolveIR
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<TPZFlopCounter> *F,TPZFMatrix<TPZFlopCounter> *result,
          TPZFMatrix<TPZFlopCounter> *residual,REAL *tol,int FromCurrent)

{
  ostream *poVar1;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "virtual void TPZMatrix<TPZFlopCounter>::SolveIR(int64_t &, TPZSolver &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, TPZFMatrix<TVar> *, REAL &, const int) [T = TPZFlopCounter]"
                          );
  std::operator<<(poVar1," is currently not implemented ");
  std::operator<<((ostream *)&std::cerr,"for this type\nAborting...");
  pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveIR(int64_t &numiterations, TPZSolver &preconditioner,
						const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
						TPZFMatrix<TVar> *residual, REAL &tol,
						const int FromCurrent)  {
    if constexpr(std::is_floating_point<TVar>::value){
        TPZMatrixSolver<TVar> &precond = dynamic_cast<TPZMatrixSolver<TVar> &>(preconditioner);
        IR(*this,result,F,precond,residual,numiterations,tol,FromCurrent);
    }else{
        PZError<<__PRETTY_FUNCTION__<<" is currently not implemented ";
        PZError<<"for this type\nAborting...";
        DebugStop();
    }
}